

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGridWrapC.cpp
# Opt level: O0

void tsgEvaluateSparseHierarchicalFunctions
               (void *grid,double *x,int num_x,int **pntr,int **indx,double **vals)

{
  int iVar1;
  int *piVar2;
  double *pdVar3;
  int num_nz;
  double **vals_local;
  int **indx_local;
  int **pntr_local;
  int num_x_local;
  double *x_local;
  void *grid_local;
  
  iVar1 = TasGrid::TasmanianSparseGrid::evaluateSparseHierarchicalFunctionsGetNZ
                    ((TasmanianSparseGrid *)grid,x,num_x);
  piVar2 = (int *)malloc((long)(num_x + 1) << 2);
  *pntr = piVar2;
  piVar2 = (int *)malloc((long)iVar1 << 2);
  *indx = piVar2;
  pdVar3 = (double *)malloc((long)iVar1 << 3);
  *vals = pdVar3;
  TasGrid::TasmanianSparseGrid::evaluateSparseHierarchicalFunctionsStatic
            ((TasmanianSparseGrid *)grid,x,num_x,*pntr,*indx,*vals);
  return;
}

Assistant:

void tsgEvaluateSparseHierarchicalFunctions(void *grid, const double x[], int num_x, int **pntr, int **indx, double **vals){
    int num_nz = ((TasmanianSparseGrid*) grid)->evaluateSparseHierarchicalFunctionsGetNZ(x, num_x);
    *pntr = (int*) malloc((num_x+1) * sizeof(int));
    *indx = (int*) malloc(num_nz * sizeof(int));
    *vals = (double*) malloc(num_nz * sizeof(double));
    ((TasmanianSparseGrid*) grid)->evaluateSparseHierarchicalFunctionsStatic(x, num_x, *pntr, *indx, *vals);
}